

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseRefKind(WastParser *this,Type *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType token_type;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string local_150;
  Type local_130;
  size_t local_128;
  char *local_120;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_118;
  Type local_110;
  Type local_108;
  Type local_100;
  Type local_f8;
  Type type;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string asStack_88 [32];
  string asStack_68 [32];
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  Type *local_20;
  Type *out_type_local;
  WastParser *this_local;
  
  local_20 = out_type;
  out_type_local = (Type *)this;
  token_type = Peek(this,0);
  bVar1 = IsTokenTypeRefKind(token_type);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"func",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_88,"extern",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 6));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_68,"exn",(allocator<char> *)((long)&token.field_2.literal_.text._M_str + 5));
    local_48 = &local_a8;
    local_40 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text._M_str + 4));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text._M_str + 4));
    this_local._4_4_ = ErrorExpected(this,&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text._M_str + 4));
    local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_160 = local_160 + -1;
      std::__cxx11::string::~string((string *)local_160);
    } while (local_160 != &local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 5));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
    return (Result)this_local._4_4_;
  }
  Consume((Token *)&type,this);
  local_100 = Token::type((Token *)&type);
  local_f8 = local_100;
  bVar1 = wabt::operator==(local_100,ExternRef);
  if ((!bVar1) || (bVar1 = Features::reference_types_enabled(&this->options_->features), bVar1)) {
    local_108 = local_f8;
    bVar1 = wabt::operator==(local_f8,Struct);
    if (bVar1) {
LAB_00203ffe:
      bVar1 = Features::gc_enabled(&this->options_->features);
      if (!bVar1) goto LAB_00204016;
    }
    else {
      local_110 = local_f8;
      bVar1 = wabt::operator==(local_f8,Array);
      if (bVar1) goto LAB_00203ffe;
    }
    *local_20 = local_f8;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
LAB_00204016:
    local_130 = type;
    local_128 = token.loc.filename._M_len;
    local_120 = token.loc.filename._M_str;
    local_118.offset = (size_t)token.loc.field_1.field_1.offset;
    Type::GetName_abi_cxx11_(&local_150,&local_f8);
    format = (char *)std::__cxx11::string::c_str();
    Error(this,0x2bc69c,format);
    std::__cxx11::string::~string((string *)&local_150);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseRefKind(Type* out_type) {
  WABT_TRACE(ParseRefKind);
  if (!IsTokenTypeRefKind(Peek())) {
    return ErrorExpected({"func", "extern", "exn"});
  }

  Token token = Consume();
  Type type = token.type();

  if ((type == Type::ExternRef &&
       !options_->features.reference_types_enabled()) ||
      ((type == Type::Struct || type == Type::Array) &&
       !options_->features.gc_enabled())) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}